

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<4,_16781328,_true,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  float fVar30;
  float fVar31;
  vint4 bi;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar33;
  float fVar41;
  float fVar42;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 ai;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  vfloat4 a0;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  vint4 ai_3;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar80 [16];
  float fVar84;
  float fVar87;
  float fVar88;
  undefined1 auVar85 [16];
  float fVar89;
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  Precalculations pre;
  NodeRef stack [244];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8 != 8) && (fVar3 = ray->tfar, 0.0 <= fVar3)) {
    aVar7 = (ray->dir).field_0.field_1;
    auVar44 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar45 = vrsqrtss_avx(auVar44,auVar44);
    fVar67 = auVar45._0_4_;
    local_818[0] = fVar67 * 1.5 - auVar44._0_4_ * 0.5 * fVar67 * fVar67 * fVar67;
    fVar67 = (ray->dir).field_0.m128[0];
    fVar4 = (ray->dir).field_0.m128[1];
    fVar5 = (ray->dir).field_0.m128[2];
    auVar51 = vshufps_avx(ZEXT416((uint)local_818[0]),ZEXT416((uint)local_818[0]),0);
    auVar68._0_4_ = aVar7.x * auVar51._0_4_;
    auVar68._4_4_ = aVar7.y * auVar51._4_4_;
    auVar68._8_4_ = aVar7.z * auVar51._8_4_;
    auVar68._12_4_ = aVar7.field_3.w * auVar51._12_4_;
    auVar45 = vshufpd_avx(auVar68,auVar68,1);
    auVar44 = vmovshdup_avx(auVar68);
    auVar76._8_4_ = 0x80000000;
    auVar76._0_8_ = 0x8000000080000000;
    auVar76._12_4_ = 0x80000000;
    auVar70._12_4_ = 0;
    auVar70._0_12_ = ZEXT812(0);
    auVar70 = auVar70 << 0x20;
    auVar74 = vunpckhps_avx(auVar68,auVar70);
    auVar61 = vshufps_avx(auVar74,ZEXT416(auVar44._0_4_ ^ 0x80000000),0x41);
    auVar74._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
    auVar74._8_8_ = auVar45._8_8_ ^ auVar76._8_8_;
    auVar74 = vinsertps_avx(auVar74,auVar68,0x2a);
    auVar44 = vdpps_avx(auVar61,auVar61,0x7f);
    auVar45 = vdpps_avx(auVar74,auVar74,0x7f);
    auVar44 = vcmpps_avx(auVar45,auVar44,1);
    auVar44 = vshufps_avx(auVar44,auVar44,0);
    auVar44 = vblendvps_avx(auVar74,auVar61,auVar44);
    auVar45 = vdpps_avx(auVar44,auVar44,0x7f);
    auVar74 = vrsqrtss_avx(auVar45,auVar45);
    fVar72 = auVar74._0_4_;
    auVar45 = ZEXT416((uint)(fVar72 * 1.5 - auVar45._0_4_ * 0.5 * fVar72 * fVar72 * fVar72));
    auVar45 = vshufps_avx(auVar45,auVar45,0);
    auVar75._0_4_ = auVar44._0_4_ * auVar45._0_4_;
    auVar75._4_4_ = auVar44._4_4_ * auVar45._4_4_;
    auVar75._8_4_ = auVar44._8_4_ * auVar45._8_4_;
    auVar75._12_4_ = auVar44._12_4_ * auVar45._12_4_;
    auVar44 = vshufps_avx(auVar75,auVar75,0xc9);
    auVar45 = vshufps_avx(auVar68,auVar68,0xc9);
    auVar78._0_4_ = auVar45._0_4_ * auVar75._0_4_;
    auVar78._4_4_ = auVar45._4_4_ * auVar75._4_4_;
    auVar78._8_4_ = auVar45._8_4_ * auVar75._8_4_;
    auVar78._12_4_ = auVar45._12_4_ * auVar75._12_4_;
    auVar77._0_4_ = auVar44._0_4_ * auVar68._0_4_;
    auVar77._4_4_ = auVar44._4_4_ * auVar68._4_4_;
    auVar77._8_4_ = auVar44._8_4_ * auVar68._8_4_;
    auVar77._12_4_ = auVar44._12_4_ * auVar68._12_4_;
    auVar44 = vsubps_avx(auVar77,auVar78);
    auVar74 = vshufps_avx(auVar44,auVar44,0xc9);
    auVar44 = vdpps_avx(auVar74,auVar74,0x7f);
    auVar45 = vrsqrtss_avx(auVar44,auVar44);
    fVar72 = auVar45._0_4_;
    auVar44 = ZEXT416((uint)(fVar72 * 1.5 - auVar44._0_4_ * 0.5 * fVar72 * fVar72 * fVar72));
    auVar44 = vshufps_avx(auVar44,auVar44,0);
    auVar45._0_4_ = auVar74._0_4_ * auVar44._0_4_;
    auVar45._4_4_ = auVar74._4_4_ * auVar44._4_4_;
    auVar45._8_4_ = auVar74._8_4_ * auVar44._8_4_;
    auVar45._12_4_ = auVar74._12_4_ * auVar44._12_4_;
    auVar44._0_4_ = auVar51._0_4_ * auVar68._0_4_;
    auVar44._4_4_ = auVar51._4_4_ * auVar68._4_4_;
    auVar44._8_4_ = auVar51._8_4_ * auVar68._8_4_;
    auVar44._12_4_ = auVar51._12_4_ * auVar68._12_4_;
    auVar74 = vunpcklps_avx(auVar75,auVar44);
    auVar44 = vunpckhps_avx(auVar75,auVar44);
    auVar51 = vunpcklps_avx(auVar45,auVar70);
    auVar45 = vunpckhps_avx(auVar45,auVar70);
    local_7e8 = vunpcklps_avx(auVar44,auVar45);
    local_808 = vunpcklps_avx(auVar74,auVar51);
    local_7f8 = vunpckhps_avx(auVar74,auVar51);
    puVar21 = local_7d0;
    auVar74 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar51._8_4_ = 0x7fffffff;
    auVar51._0_8_ = 0x7fffffff7fffffff;
    auVar51._12_4_ = 0x7fffffff;
    auVar44 = vandps_avx((undefined1  [16])aVar7,auVar51);
    auVar61._8_4_ = 0x219392ef;
    auVar61._0_8_ = 0x219392ef219392ef;
    auVar61._12_4_ = 0x219392ef;
    auVar44 = vcmpps_avx(auVar44,auVar61,1);
    auVar25._8_4_ = 0x3f800000;
    auVar25._0_8_ = 0x3f8000003f800000;
    auVar25._12_4_ = 0x3f800000;
    auVar45 = vdivps_avx(auVar25,(undefined1  [16])aVar7);
    auVar62._8_4_ = 0x5d5e0b6b;
    auVar62._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar62._12_4_ = 0x5d5e0b6b;
    auVar44 = vblendvps_avx(auVar45,auVar62,auVar44);
    auVar52._0_4_ = auVar44._0_4_ * 0.99999964;
    auVar52._4_4_ = auVar44._4_4_ * 0.99999964;
    auVar52._8_4_ = auVar44._8_4_ * 0.99999964;
    auVar52._12_4_ = auVar44._12_4_ * 0.99999964;
    auVar34._0_4_ = auVar44._0_4_ * 1.0000004;
    auVar34._4_4_ = auVar44._4_4_ * 1.0000004;
    auVar34._8_4_ = auVar44._8_4_ * 1.0000004;
    auVar34._12_4_ = auVar44._12_4_ * 1.0000004;
    auVar51 = vshufps_avx(auVar52,auVar52,0);
    auVar44 = vmovshdup_avx(auVar52);
    auVar61 = vshufps_avx(auVar52,auVar52,0x55);
    auVar45 = vshufpd_avx(auVar52,auVar52,1);
    auVar70 = vshufps_avx(auVar52,auVar52,0xaa);
    uVar23 = (ulong)(auVar52._0_4_ < 0.0) * 0x10;
    auVar52 = vshufps_avx(auVar34,auVar34,0);
    uVar22 = (ulong)(auVar44._0_4_ < 0.0) << 4 | 0x20;
    auVar44 = vshufps_avx(auVar34,auVar34,0x55);
    auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
    uVar20 = (ulong)(auVar45._0_4_ < 0.0) << 4 | 0x40;
    auVar45 = vshufps_avx(auVar74,auVar74,0);
    auVar74 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
    fVar3 = (ray->org).field_0.m128[0];
    auVar85._4_4_ = fVar3;
    auVar85._0_4_ = fVar3;
    auVar85._8_4_ = fVar3;
    auVar85._12_4_ = fVar3;
    fVar72 = (ray->org).field_0.m128[1];
    fVar6 = (ray->org).field_0.m128[2];
LAB_002bd67c:
    do {
      if (puVar21 == &local_7d8) {
        return;
      }
      uVar17 = puVar21[-1];
      puVar21 = puVar21 + -1;
      while ((uVar17 & 8) == 0) {
        fVar93 = (ray->dir).field_0.m128[3];
        uVar18 = (uint)uVar17 & 7;
        uVar16 = uVar17 & 0xfffffffffffffff0;
        if (uVar18 == 3) {
          auVar25 = vshufps_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93),0);
          fVar79 = auVar25._0_4_;
          fVar81 = auVar25._4_4_;
          fVar82 = auVar25._8_4_;
          fVar83 = auVar25._12_4_;
          fVar93 = 1.0 - fVar93;
          auVar25 = vshufps_avx(ZEXT416((uint)(fVar93 * 0.0)),ZEXT416((uint)(fVar93 * 0.0)),0);
          fVar84 = auVar25._0_4_;
          fVar87 = auVar25._4_4_;
          fVar88 = auVar25._8_4_;
          fVar89 = auVar25._12_4_;
          auVar37._0_4_ =
               fVar67 * *(float *)(uVar16 + 0x20) +
               fVar4 * *(float *)(uVar16 + 0x50) + *(float *)(uVar16 + 0x80) * fVar5;
          auVar37._4_4_ =
               fVar67 * *(float *)(uVar16 + 0x24) +
               fVar4 * *(float *)(uVar16 + 0x54) + *(float *)(uVar16 + 0x84) * fVar5;
          auVar37._8_4_ =
               fVar67 * *(float *)(uVar16 + 0x28) +
               fVar4 * *(float *)(uVar16 + 0x58) + *(float *)(uVar16 + 0x88) * fVar5;
          auVar37._12_4_ =
               fVar67 * *(float *)(uVar16 + 0x2c) +
               fVar4 * *(float *)(uVar16 + 0x5c) + *(float *)(uVar16 + 0x8c) * fVar5;
          auVar86._0_4_ =
               *(float *)(uVar16 + 0x30) * fVar67 +
               *(float *)(uVar16 + 0x60) * fVar4 + *(float *)(uVar16 + 0x90) * fVar5;
          auVar86._4_4_ =
               *(float *)(uVar16 + 0x34) * fVar67 +
               *(float *)(uVar16 + 100) * fVar4 + *(float *)(uVar16 + 0x94) * fVar5;
          auVar86._8_4_ =
               *(float *)(uVar16 + 0x38) * fVar67 +
               *(float *)(uVar16 + 0x68) * fVar4 + *(float *)(uVar16 + 0x98) * fVar5;
          auVar86._12_4_ =
               *(float *)(uVar16 + 0x3c) * fVar67 +
               *(float *)(uVar16 + 0x6c) * fVar4 + *(float *)(uVar16 + 0x9c) * fVar5;
          auVar90._0_4_ =
               *(float *)(uVar16 + 0x40) * fVar67 +
               fVar4 * *(float *)(uVar16 + 0x70) + fVar5 * *(float *)(uVar16 + 0xa0);
          auVar90._4_4_ =
               *(float *)(uVar16 + 0x44) * fVar67 +
               fVar4 * *(float *)(uVar16 + 0x74) + fVar5 * *(float *)(uVar16 + 0xa4);
          auVar90._8_4_ =
               *(float *)(uVar16 + 0x48) * fVar67 +
               fVar4 * *(float *)(uVar16 + 0x78) + fVar5 * *(float *)(uVar16 + 0xa8);
          auVar90._12_4_ =
               *(float *)(uVar16 + 0x4c) * fVar67 +
               fVar4 * *(float *)(uVar16 + 0x7c) + fVar5 * *(float *)(uVar16 + 0xac);
          auVar57._8_4_ = 0x7fffffff;
          auVar57._0_8_ = 0x7fffffff7fffffff;
          auVar57._12_4_ = 0x7fffffff;
          auVar25 = vandps_avx(auVar37,auVar57);
          auVar26._8_4_ = 0x219392ef;
          auVar26._0_8_ = 0x219392ef219392ef;
          auVar26._12_4_ = 0x219392ef;
          auVar25 = vcmpps_avx(auVar25,auVar26,1);
          auVar62 = vblendvps_avx(auVar37,auVar26,auVar25);
          auVar25 = vandps_avx(auVar86,auVar57);
          auVar25 = vcmpps_avx(auVar25,auVar26,1);
          auVar68 = vblendvps_avx(auVar86,auVar26,auVar25);
          auVar25 = vandps_avx(auVar90,auVar57);
          auVar25 = vcmpps_avx(auVar25,auVar26,1);
          auVar25 = vblendvps_avx(auVar90,auVar26,auVar25);
          auVar75 = vshufps_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93),0);
          fVar92 = auVar75._0_4_;
          auVar91._0_4_ = fVar92 + fVar79 * *(float *)(uVar16 + 0x110);
          fVar94 = auVar75._4_4_;
          auVar91._4_4_ = fVar94 + fVar81 * *(float *)(uVar16 + 0x114);
          fVar96 = auVar75._8_4_;
          auVar91._8_4_ = fVar96 + fVar82 * *(float *)(uVar16 + 0x118);
          fVar98 = auVar75._12_4_;
          auVar91._12_4_ = fVar98 + fVar83 * *(float *)(uVar16 + 0x11c);
          auVar80._0_4_ = fVar92 + fVar79 * *(float *)(uVar16 + 0x130);
          auVar80._4_4_ = fVar94 + fVar81 * *(float *)(uVar16 + 0x134);
          auVar80._8_4_ = fVar96 + fVar82 * *(float *)(uVar16 + 0x138);
          auVar80._12_4_ = fVar98 + fVar83 * *(float *)(uVar16 + 0x13c);
          auVar75 = vrcpps_avx(auVar62);
          fVar93 = auVar75._0_4_;
          auVar38._0_4_ = auVar62._0_4_ * fVar93;
          fVar95 = auVar75._4_4_;
          auVar38._4_4_ = auVar62._4_4_ * fVar95;
          fVar97 = auVar75._8_4_;
          auVar38._8_4_ = auVar62._8_4_ * fVar97;
          fVar99 = auVar75._12_4_;
          auVar38._12_4_ = auVar62._12_4_ * fVar99;
          auVar50._8_4_ = 0x3f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar50._12_4_ = 0x3f800000;
          auVar62 = vsubps_avx(auVar50,auVar38);
          fVar93 = fVar93 + fVar93 * auVar62._0_4_;
          fVar95 = fVar95 + fVar95 * auVar62._4_4_;
          fVar97 = fVar97 + fVar97 * auVar62._8_4_;
          fVar99 = fVar99 + fVar99 * auVar62._12_4_;
          auVar62 = vrcpps_avx(auVar68);
          fVar33 = auVar62._0_4_;
          auVar27._0_4_ = auVar68._0_4_ * fVar33;
          fVar41 = auVar62._4_4_;
          auVar27._4_4_ = auVar68._4_4_ * fVar41;
          fVar42 = auVar62._8_4_;
          auVar27._8_4_ = auVar68._8_4_ * fVar42;
          fVar43 = auVar62._12_4_;
          auVar27._12_4_ = auVar68._12_4_ * fVar43;
          auVar62 = vsubps_avx(auVar50,auVar27);
          fVar33 = fVar33 + fVar33 * auVar62._0_4_;
          fVar41 = fVar41 + fVar41 * auVar62._4_4_;
          fVar42 = fVar42 + fVar42 * auVar62._8_4_;
          fVar43 = fVar43 + fVar43 * auVar62._12_4_;
          auVar62 = vrcpps_avx(auVar25);
          fVar24 = auVar62._0_4_;
          auVar58._0_4_ = auVar25._0_4_ * fVar24;
          fVar30 = auVar62._4_4_;
          auVar58._4_4_ = auVar25._4_4_ * fVar30;
          fVar31 = auVar62._8_4_;
          auVar58._8_4_ = auVar25._8_4_ * fVar31;
          fVar32 = auVar62._12_4_;
          auVar58._12_4_ = auVar25._12_4_ * fVar32;
          auVar25 = vsubps_avx(auVar50,auVar58);
          fVar24 = fVar24 + fVar24 * auVar25._0_4_;
          fVar30 = fVar30 + fVar30 * auVar25._4_4_;
          fVar31 = fVar31 + fVar31 * auVar25._8_4_;
          fVar32 = fVar32 + fVar32 * auVar25._12_4_;
          auVar59._0_4_ =
               fVar3 * *(float *)(uVar16 + 0x20) +
               fVar72 * *(float *)(uVar16 + 0x50) +
               *(float *)(uVar16 + 0x80) * fVar6 + *(float *)(uVar16 + 0xb0);
          auVar59._4_4_ =
               fVar3 * *(float *)(uVar16 + 0x24) +
               fVar72 * *(float *)(uVar16 + 0x54) +
               *(float *)(uVar16 + 0x84) * fVar6 + *(float *)(uVar16 + 0xb4);
          auVar59._8_4_ =
               fVar3 * *(float *)(uVar16 + 0x28) +
               fVar72 * *(float *)(uVar16 + 0x58) +
               *(float *)(uVar16 + 0x88) * fVar6 + *(float *)(uVar16 + 0xb8);
          auVar59._12_4_ =
               fVar3 * *(float *)(uVar16 + 0x2c) +
               fVar72 * *(float *)(uVar16 + 0x5c) +
               *(float *)(uVar16 + 0x8c) * fVar6 + *(float *)(uVar16 + 0xbc);
          auVar65._0_4_ =
               fVar3 * *(float *)(uVar16 + 0x30) +
               fVar72 * *(float *)(uVar16 + 0x60) +
               *(float *)(uVar16 + 0x90) * fVar6 + *(float *)(uVar16 + 0xc0);
          auVar65._4_4_ =
               fVar3 * *(float *)(uVar16 + 0x34) +
               fVar72 * *(float *)(uVar16 + 100) +
               *(float *)(uVar16 + 0x94) * fVar6 + *(float *)(uVar16 + 0xc4);
          auVar65._8_4_ =
               fVar3 * *(float *)(uVar16 + 0x38) +
               fVar72 * *(float *)(uVar16 + 0x68) +
               *(float *)(uVar16 + 0x98) * fVar6 + *(float *)(uVar16 + 200);
          auVar65._12_4_ =
               fVar3 * *(float *)(uVar16 + 0x3c) +
               fVar72 * *(float *)(uVar16 + 0x6c) +
               *(float *)(uVar16 + 0x9c) * fVar6 + *(float *)(uVar16 + 0xcc);
          auVar71._0_4_ =
               fVar3 * *(float *)(uVar16 + 0x40) +
               fVar72 * *(float *)(uVar16 + 0x70) +
               fVar6 * *(float *)(uVar16 + 0xa0) + *(float *)(uVar16 + 0xd0);
          auVar71._4_4_ =
               fVar3 * *(float *)(uVar16 + 0x44) +
               fVar72 * *(float *)(uVar16 + 0x74) +
               fVar6 * *(float *)(uVar16 + 0xa4) + *(float *)(uVar16 + 0xd4);
          auVar71._8_4_ =
               fVar3 * *(float *)(uVar16 + 0x48) +
               fVar72 * *(float *)(uVar16 + 0x78) +
               fVar6 * *(float *)(uVar16 + 0xa8) + *(float *)(uVar16 + 0xd8);
          auVar71._12_4_ =
               fVar3 * *(float *)(uVar16 + 0x4c) +
               fVar72 * *(float *)(uVar16 + 0x7c) +
               fVar6 * *(float *)(uVar16 + 0xac) + *(float *)(uVar16 + 0xdc);
          auVar13._4_4_ = fVar87 + fVar81 * *(float *)(uVar16 + 0xe4);
          auVar13._0_4_ = fVar84 + fVar79 * *(float *)(uVar16 + 0xe0);
          auVar13._8_4_ = fVar88 + fVar82 * *(float *)(uVar16 + 0xe8);
          auVar13._12_4_ = fVar89 + fVar83 * *(float *)(uVar16 + 0xec);
          auVar25 = vsubps_avx(auVar13,auVar59);
          auVar62 = vsubps_avx(auVar91,auVar59);
          auVar14._4_4_ = fVar87 + fVar81 * *(float *)(uVar16 + 0xf4);
          auVar14._0_4_ = fVar84 + fVar79 * *(float *)(uVar16 + 0xf0);
          auVar14._8_4_ = fVar88 + fVar82 * *(float *)(uVar16 + 0xf8);
          auVar14._12_4_ = fVar89 + fVar83 * *(float *)(uVar16 + 0xfc);
          auVar68 = vsubps_avx(auVar14,auVar65);
          auVar12._4_4_ = fVar94 + fVar81 * *(float *)(uVar16 + 0x124);
          auVar12._0_4_ = fVar92 + fVar79 * *(float *)(uVar16 + 0x120);
          auVar12._8_4_ = fVar96 + fVar82 * *(float *)(uVar16 + 0x128);
          auVar12._12_4_ = fVar98 + fVar83 * *(float *)(uVar16 + 300);
          auVar75 = vsubps_avx(auVar12,auVar65);
          auVar9._4_4_ = fVar87 + fVar81 * *(float *)(uVar16 + 0x104);
          auVar9._0_4_ = fVar84 + fVar79 * *(float *)(uVar16 + 0x100);
          auVar9._8_4_ = fVar88 + fVar82 * *(float *)(uVar16 + 0x108);
          auVar9._12_4_ = fVar89 + fVar83 * *(float *)(uVar16 + 0x10c);
          auVar76 = vsubps_avx(auVar9,auVar71);
          auVar77 = vsubps_avx(auVar80,auVar71);
          auVar69._0_4_ = fVar93 * auVar25._0_4_;
          auVar69._4_4_ = fVar95 * auVar25._4_4_;
          auVar69._8_4_ = fVar97 * auVar25._8_4_;
          auVar69._12_4_ = fVar99 * auVar25._12_4_;
          auVar60._0_4_ = fVar93 * auVar62._0_4_;
          auVar60._4_4_ = fVar95 * auVar62._4_4_;
          auVar60._8_4_ = fVar97 * auVar62._8_4_;
          auVar60._12_4_ = fVar99 * auVar62._12_4_;
          auVar73._0_4_ = auVar68._0_4_ * fVar33;
          auVar73._4_4_ = auVar68._4_4_ * fVar41;
          auVar73._8_4_ = auVar68._8_4_ * fVar42;
          auVar73._12_4_ = auVar68._12_4_ * fVar43;
          auVar66._0_4_ = auVar76._0_4_ * fVar24;
          auVar66._4_4_ = auVar76._4_4_ * fVar30;
          auVar66._8_4_ = auVar76._8_4_ * fVar31;
          auVar66._12_4_ = auVar76._12_4_ * fVar32;
          auVar39._0_4_ = auVar75._0_4_ * fVar33;
          auVar39._4_4_ = auVar75._4_4_ * fVar41;
          auVar39._8_4_ = auVar75._8_4_ * fVar42;
          auVar39._12_4_ = auVar75._12_4_ * fVar43;
          auVar28._0_4_ = auVar77._0_4_ * fVar24;
          auVar28._4_4_ = auVar77._4_4_ * fVar30;
          auVar28._8_4_ = auVar77._8_4_ * fVar31;
          auVar28._12_4_ = auVar77._12_4_ * fVar32;
          auVar25 = vpminsd_avx(auVar73,auVar39);
          auVar62 = vpminsd_avx(auVar66,auVar28);
          auVar25 = vmaxps_avx(auVar25,auVar62);
          auVar76 = vpminsd_avx(auVar69,auVar60);
          auVar75 = vpmaxsd_avx(auVar69,auVar60);
          auVar62 = vpmaxsd_avx(auVar73,auVar39);
          auVar68 = vpmaxsd_avx(auVar66,auVar28);
          auVar68 = vminps_avx(auVar62,auVar68);
          auVar62 = vmaxps_avx(auVar45,auVar76);
          auVar25 = vmaxps_avx(auVar62,auVar25);
          auVar62 = vminps_avx(auVar74,auVar75);
          auVar62 = vminps_avx(auVar62,auVar68);
          auVar40._0_4_ = auVar25._0_4_ * 0.99999964;
          auVar40._4_4_ = auVar25._4_4_ * 0.99999964;
          auVar40._8_4_ = auVar25._8_4_ * 0.99999964;
          auVar40._12_4_ = auVar25._12_4_ * 0.99999964;
          auVar29._0_4_ = auVar62._0_4_ * 1.0000004;
          auVar29._4_4_ = auVar62._4_4_ * 1.0000004;
          auVar29._8_4_ = auVar62._8_4_ * 1.0000004;
          auVar29._12_4_ = auVar62._12_4_ * 1.0000004;
          auVar25 = vcmpps_avx(auVar40,auVar29,2);
        }
        else {
          auVar75 = vshufps_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93),0);
          pfVar2 = (float *)(uVar16 + 0x80 + uVar23);
          fVar93 = auVar75._0_4_;
          fVar33 = auVar75._4_4_;
          fVar24 = auVar75._8_4_;
          fVar95 = auVar75._12_4_;
          pfVar1 = (float *)(uVar16 + 0x20 + uVar23);
          auVar35._0_4_ = fVar93 * *pfVar2 + *pfVar1;
          auVar35._4_4_ = fVar33 * pfVar2[1] + pfVar1[1];
          auVar35._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
          auVar35._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
          auVar25 = vsubps_avx(auVar35,auVar85);
          pfVar2 = (float *)(uVar16 + 0x80 + uVar22);
          auVar36._0_4_ = auVar51._0_4_ * auVar25._0_4_;
          auVar36._4_4_ = auVar51._4_4_ * auVar25._4_4_;
          auVar36._8_4_ = auVar51._8_4_ * auVar25._8_4_;
          auVar36._12_4_ = auVar51._12_4_ * auVar25._12_4_;
          pfVar1 = (float *)(uVar16 + 0x20 + uVar22);
          auVar46._0_4_ = fVar93 * *pfVar2 + *pfVar1;
          auVar46._4_4_ = fVar33 * pfVar2[1] + pfVar1[1];
          auVar46._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
          auVar46._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
          auVar11._4_4_ = fVar72;
          auVar11._0_4_ = fVar72;
          auVar11._8_4_ = fVar72;
          auVar11._12_4_ = fVar72;
          auVar25 = vsubps_avx(auVar46,auVar11);
          pfVar2 = (float *)(uVar16 + 0x80 + uVar20);
          pfVar1 = (float *)(uVar16 + 0x20 + uVar20);
          auVar53._0_4_ = fVar93 * *pfVar2 + *pfVar1;
          auVar53._4_4_ = fVar33 * pfVar2[1] + pfVar1[1];
          auVar53._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
          auVar53._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
          auVar47._0_4_ = auVar61._0_4_ * auVar25._0_4_;
          auVar47._4_4_ = auVar61._4_4_ * auVar25._4_4_;
          auVar47._8_4_ = auVar61._8_4_ * auVar25._8_4_;
          auVar47._12_4_ = auVar61._12_4_ * auVar25._12_4_;
          auVar10._4_4_ = fVar6;
          auVar10._0_4_ = fVar6;
          auVar10._8_4_ = fVar6;
          auVar10._12_4_ = fVar6;
          auVar25 = vsubps_avx(auVar53,auVar10);
          auVar54._0_4_ = auVar70._0_4_ * auVar25._0_4_;
          auVar54._4_4_ = auVar70._4_4_ * auVar25._4_4_;
          auVar54._8_4_ = auVar70._8_4_ * auVar25._8_4_;
          auVar54._12_4_ = auVar70._12_4_ * auVar25._12_4_;
          auVar25 = vmaxps_avx(auVar47,auVar54);
          auVar62 = vmaxps_avx(auVar45,auVar36);
          auVar25 = vmaxps_avx(auVar62,auVar25);
          pfVar2 = (float *)(uVar16 + 0x80 + (uVar23 ^ 0x10));
          pfVar1 = (float *)(uVar16 + 0x20 + (uVar23 ^ 0x10));
          auVar48._0_4_ = fVar93 * *pfVar2 + *pfVar1;
          auVar48._4_4_ = fVar33 * pfVar2[1] + pfVar1[1];
          auVar48._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
          auVar48._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
          auVar62 = vsubps_avx(auVar48,auVar85);
          auVar49._0_4_ = auVar52._0_4_ * auVar62._0_4_;
          auVar49._4_4_ = auVar52._4_4_ * auVar62._4_4_;
          auVar49._8_4_ = auVar52._8_4_ * auVar62._8_4_;
          auVar49._12_4_ = auVar52._12_4_ * auVar62._12_4_;
          pfVar2 = (float *)(uVar16 + 0x80 + (uVar22 ^ 0x10));
          pfVar1 = (float *)(uVar16 + 0x20 + (uVar22 ^ 0x10));
          auVar55._0_4_ = fVar93 * *pfVar2 + *pfVar1;
          auVar55._4_4_ = fVar33 * pfVar2[1] + pfVar1[1];
          auVar55._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
          auVar55._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
          auVar62 = vsubps_avx(auVar55,auVar11);
          auVar56._0_4_ = auVar44._0_4_ * auVar62._0_4_;
          auVar56._4_4_ = auVar44._4_4_ * auVar62._4_4_;
          auVar56._8_4_ = auVar44._8_4_ * auVar62._8_4_;
          auVar56._12_4_ = auVar44._12_4_ * auVar62._12_4_;
          pfVar2 = (float *)(uVar16 + 0x80 + (uVar20 ^ 0x10));
          pfVar1 = (float *)(uVar16 + 0x20 + (uVar20 ^ 0x10));
          auVar63._0_4_ = fVar93 * *pfVar2 + *pfVar1;
          auVar63._4_4_ = fVar33 * pfVar2[1] + pfVar1[1];
          auVar63._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
          auVar63._12_4_ = fVar95 * pfVar2[3] + pfVar1[3];
          auVar62 = vsubps_avx(auVar63,auVar10);
          auVar64._0_4_ = auVar34._0_4_ * auVar62._0_4_;
          auVar64._4_4_ = auVar34._4_4_ * auVar62._4_4_;
          auVar64._8_4_ = auVar34._8_4_ * auVar62._8_4_;
          auVar64._12_4_ = auVar34._12_4_ * auVar62._12_4_;
          auVar62 = vminps_avx(auVar56,auVar64);
          auVar68 = vminps_avx(auVar74,auVar49);
          auVar62 = vminps_avx(auVar68,auVar62);
          if (uVar18 == 6) {
            auVar62 = vcmpps_avx(auVar25,auVar62,2);
            auVar25 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar75,2);
            auVar68 = vcmpps_avx(auVar75,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
            auVar25 = vandps_avx(auVar25,auVar68);
            auVar25 = vandps_avx(auVar25,auVar62);
          }
          else {
            auVar25 = vcmpps_avx(auVar25,auVar62,2);
          }
        }
        auVar25 = vpslld_avx(auVar25,0x1f);
        uVar18 = vmovmskps_avx(auVar25);
        if (uVar18 == 0) goto LAB_002bd67c;
        uVar18 = uVar18 & 0xff;
        lVar8 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar17 = *(ulong *)(uVar16 + lVar8 * 8);
        uVar18 = uVar18 - 1 & uVar18;
        if (uVar18 != 0) {
          *puVar21 = uVar17;
          puVar21 = puVar21 + 1;
          lVar8 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          uVar17 = *(ulong *)(uVar16 + lVar8 * 8);
          uVar18 = uVar18 - 1 & uVar18;
          uVar19 = (ulong)uVar18;
          if (uVar18 != 0) {
            do {
              *puVar21 = uVar17;
              puVar21 = puVar21 + 1;
              lVar8 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                }
              }
              uVar17 = *(ulong *)(uVar16 + lVar8 * 8);
              uVar19 = uVar19 & uVar19 - 1;
            } while (uVar19 != 0);
          }
        }
      }
      cVar15 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar17 & 0xfffffffffffffff0) * 0x40 + 8))
                         (local_818,ray,context);
    } while (cVar15 == '\0');
    ray->tfar = -INFINITY;
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }